

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsSimpleTextItem::paint
          (QGraphicsSimpleTextItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  int iVar1;
  BrushStyle BVar2;
  QFlagsStorage<QStyle::StateFlag> other;
  Int IVar3;
  QGraphicsSimpleTextItemPrivate *pQVar4;
  qsizetype qVar5;
  int in_EDX;
  QFont *in_RSI;
  QList<QTextLayout::FormatRange> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSimpleTextItemPrivate *d;
  QPen p;
  QTextLayout layout;
  QString tmp;
  FormatRange range;
  QStackTextEngine engine;
  QString *in_stack_ffffffffffffd528;
  parameter_type in_stack_ffffffffffffd530;
  QTextCharFormat *in_stack_ffffffffffffd538;
  undefined4 in_stack_ffffffffffffd548;
  undefined4 in_stack_ffffffffffffd54c;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_2a84;
  QStyleOptionGraphicsItem *in_stack_ffffffffffffd580;
  QPainter *in_stack_ffffffffffffd588;
  QGraphicsItem *in_stack_ffffffffffffd590;
  undefined1 local_2a60 [24];
  QPointF local_2a48 [4];
  QString local_2a00;
  undefined1 *local_29e8;
  QTextLayout local_29e0;
  QChar local_29d4;
  QChar local_29d2;
  undefined1 *local_29d0;
  undefined1 *local_29c8;
  undefined1 *local_29c0;
  undefined8 local_29b8;
  undefined1 *local_29b0;
  undefined1 *local_29a8;
  QStackTextEngine local_29a0 [10648];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QGraphicsSimpleTextItem *)0x98ed1f);
  QPainter::setFont(in_RSI);
  local_29d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_29c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_29c0 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_ffffffffffffd530,in_stack_ffffffffffffd528);
  QChar::QChar<char16_t,_true>(&local_29d2,L'\n');
  QChar::QChar<QChar::SpecialCharacter,_true>(&local_29d4,LineSeparator);
  QString::replace((QChar *)&local_29d0,(QChar *)(ulong)(ushort)local_29d2.ucs,
                   (uint)(ushort)local_29d4.ucs);
  QStackTextEngine::QStackTextEngine(local_29a0,(QString *)&local_29d0,&pQVar4->font);
  local_29e0.d = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
  QTextLayout::QTextLayout(&local_29e0,(QTextEngine *)local_29a0);
  local_29e8 = &DAT_aaaaaaaaaaaaaaaa;
  QPen::QPen((QPen *)&local_29e8);
  QPen::setBrush((QBrush *)&local_29e8);
  QPainter::setPen((QPen *)in_RSI);
  iVar1 = QPen::style();
  if (iVar1 == 0) {
    BVar2 = QBrush::style((QBrush *)0x98ee7c);
    if (BVar2 == SolidPattern) {
      QPainter::setBrush((BrushStyle)in_RSI);
      goto LAB_0098ef73;
    }
  }
  local_29b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_29b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_29a8 = &DAT_aaaaaaaaaaaaaaaa;
  QTextLayout::FormatRange::FormatRange((FormatRange *)0x98eecc);
  local_29b8 = (undefined1 *)((ulong)local_29b8 & 0xffffffff00000000);
  QTextLayout::text();
  qVar5 = QString::size(&local_2a00);
  local_29b8 = (undefined1 *)CONCAT44((int)qVar5,(undefined4)local_29b8);
  QString::~QString((QString *)0x98ef0d);
  QTextCharFormat::setTextOutline(in_stack_ffffffffffffd538,(QPen *)in_stack_ffffffffffffd530);
  QList<QTextLayout::FormatRange>::QList
            (in_RDI,(qsizetype)in_stack_ffffffffffffd538,in_stack_ffffffffffffd530);
  QTextLayout::setFormats((QList_conflict2 *)&local_29e0);
  QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x98ef66);
  QTextLayout::FormatRange::~FormatRange((FormatRange *)0x98ef73);
LAB_0098ef73:
  setupTextLayout((QTextLayout *)CONCAT44(in_stack_ffffffffffffd54c,in_stack_ffffffffffffd548));
  QPointF::QPointF(local_2a48,0.0,0.0);
  memset(local_2a60,0,0x18);
  QList<QTextLayout::FormatRange>::QList((QList<QTextLayout::FormatRange> *)0x98efc0);
  QRectF::QRectF((QRectF *)&stack0xffffffffffffd580);
  QTextLayout::draw((QPainter *)&local_29e0,(QPointF *)in_RSI,(QList_conflict2 *)local_2a48,
                    (QRectF *)local_2a60);
  QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x98eff8);
  other.i = in_EDX + 8;
  ::operator|((enum_type)((ulong)in_RSI >> 0x20),(enum_type)in_RSI);
  local_2a84.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)in_RSI,(QFlags<QStyle::StateFlag>)other.i);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2a84);
  if (IVar3 != 0) {
    qt_graphicsItem_highlightSelected
              (in_stack_ffffffffffffd590,in_stack_ffffffffffffd588,in_stack_ffffffffffffd580);
  }
  QPen::~QPen((QPen *)&local_29e8);
  QTextLayout::~QTextLayout(&local_29e0);
  QStackTextEngine::~QStackTextEngine((QStackTextEngine *)in_RSI);
  QString::~QString((QString *)0x98f082);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSimpleTextItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option, QWidget *widget)
{
    Q_UNUSED(widget);
    Q_D(QGraphicsSimpleTextItem);

    painter->setFont(d->font);

    QString tmp = d->text;
    tmp.replace(u'\n', QChar::LineSeparator);
    Q_DECL_UNINITIALIZED QStackTextEngine engine(tmp, d->font);
    QTextLayout layout(&engine);

    QPen p;
    p.setBrush(d->brush);
    painter->setPen(p);
    if (d->pen.style() == Qt::NoPen && d->brush.style() == Qt::SolidPattern) {
        painter->setBrush(Qt::NoBrush);
    } else {
        QTextLayout::FormatRange range;
        range.start = 0;
        range.length = layout.text().size();
        range.format.setTextOutline(d->pen);
        layout.setFormats(QList<QTextLayout::FormatRange>(1, range));
    }

    setupTextLayout(&layout);
    layout.draw(painter, QPointF(0, 0));

    if (option->state & (QStyle::State_Selected | QStyle::State_HasFocus))
        qt_graphicsItem_highlightSelected(this, painter, option);
}